

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::commoditizedUnit(string *unit_string,uint64_t match_flags)

{
  uint32_t uVar1;
  int iVar2;
  size_type sVar3;
  const_iterator cVar4;
  undefined8 uVar5;
  long lVar6;
  precise_unit pVar7;
  precise_unit pVar8;
  undefined1 local_3cb;
  undefined1 local_3ca;
  undefined1 local_3c9;
  double local_3c8;
  precise_unit bunit;
  int ccindex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cstring;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_2f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_58;
  
  uVar5 = 0xfa94a488;
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (unit_string,'}',0xffffffffffffffff);
  if (sVar3 == 0xffffffffffffffff) {
    local_3c8 = NAN;
    goto LAB_00355ee3;
  }
  ccindex = (int)sVar3 + -1;
  segmentcheckReverse(unit_string,'{',&ccindex);
  lVar6 = (long)ccindex;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cstring,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
             lVar6 + 2,(sVar3 - lVar6) - 2);
  if (lVar6 < 0) {
    std::__cxx11::string::string
              ((string *)&local_348,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cstring);
    uVar1 = getCommodity(&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    pVar7.base_units_ = (unit_data)(int)((ulong)uVar1 << 0x20);
    pVar7.commodity_ = (int)(((ulong)uVar1 << 0x20) >> 0x20);
    pVar7.multiplier_ = 1.0;
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_368,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
               lVar6 + 1);
    pVar7 = unit_from_string_internal((string *)&local_368,match_flags + 0x4000000);
    local_3c8 = pVar7.multiplier_;
    bunit = pVar7;
    std::__cxx11::string::~string((string *)&local_368);
    if (pVar7.base_units_ == (unit_data)0xfa94a488 || NAN(local_3c8)) {
      pVar7.base_units_ = (unit_data)0xfa94a488;
      pVar7.commodity_ = 0;
      pVar7.multiplier_ = NAN;
    }
    else {
      if (((uint)pVar7.base_units_ & 0xfffffff) == 1) {
        if (commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::commUnits_abi_cxx11_ ==
            '\0') {
          iVar2 = __cxa_guard_acquire(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                                       commUnits_abi_cxx11_);
          if (iVar2 != 0) {
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[8],_true>
                      (&local_328,(char (*) [8])"mercury",
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[14],_true>
                      (&local_2f8,(char (*) [14])"mercurycolumn",
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (&local_2c8,(char (*) [13])"mercuryguage",
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[10],_true>
                      (&local_298,(char (*) [10])"mercury_i",
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[3],_true>
                      (&local_268,(char (*) [3])0x3ade2f,
                       (precise_unit *)precise::pressure::bases::Hg);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[6],_true>
                      (&local_238,(char (*) [6])"water",
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[12],_true>
                      (&local_208,(char (*) [12])"watercolumn",
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[8],_true>
                      (&local_1d8,(char (*) [8])"water_i",
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (&local_1a8,(char (*) [11])"waterguage",
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[4],_true>
                      (&local_178,(char (*) [4])0x3ade49,
                       (precise_unit *)precise::pressure::bases::water);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (&local_148,(char (*) [13])"mercury_[00]",
                       (precise_unit *)precise::pressure::bases::Hg_0);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (&local_118,(char (*) [11])"water_[04]",
                       (precise_unit *)precise::pressure::bases::water_4);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (&local_e8,(char (*) [11])"water_[39]",
                       (precise_unit *)precise::pressure::bases::water_39);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (&local_b8,(char (*) [13])"mercury_[32]",
                       (precise_unit *)precise::pressure::bases::Hg_32);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[13],_true>
                      (&local_88,(char (*) [13])"mercury_[60]",
                       (precise_unit *)precise::pressure::bases::Hg_60);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::pair<const_char_(&)[11],_true>
                      (&local_58,(char (*) [11])"water_[60]",
                       (precise_unit *)precise::pressure::bases::water_60);
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_Hashtable<std::pair<std::__cxx11::string_const,units::precise_unit>const*>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                           commUnits_abi_cxx11_,&local_328,&stack0xffffffffffffffd8,0,&local_3c9,
                       &local_3ca,&local_3cb);
            lVar6 = 0x2d0;
            do {
              std::__cxx11::string::~string
                        ((string *)((long)&local_328.first._M_dataplus._M_p + lVar6));
              lVar6 = lVar6 + -0x30;
            } while (lVar6 != -0x30);
            __cxa_atexit(std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                         ::~unordered_map,
                         &commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                          commUnits_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                                 commUnits_abi_cxx11_);
          }
        }
        cVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                        commUnits_abi_cxx11_._M_h,&cstring);
        if (cVar4.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
            ._M_cur != (__node_type *)0x0) {
          pVar7 = precise_unit::operator*
                            (&bunit,(precise_unit *)
                                    ((long)cVar4.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                                           ._M_cur + 0x28));
          goto LAB_00355ecd;
        }
      }
      std::__cxx11::string::string
                ((string *)&local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cstring);
      uVar1 = getCommodity(&local_388);
      local_3c8 = bunit.multiplier_;
      pVar7.commodity_ = uVar1 | bunit.commodity_;
      pVar7.base_units_ = bunit.base_units_;
      std::__cxx11::string::~string((string *)&local_388);
      pVar7.multiplier_ = local_3c8;
    }
  }
LAB_00355ecd:
  uVar5 = pVar7._8_8_;
  local_3c8 = pVar7.multiplier_;
  std::__cxx11::string::~string((string *)&cstring);
LAB_00355ee3:
  pVar8.base_units_ = (unit_data)(int)uVar5;
  pVar8.commodity_ = (int)((ulong)uVar5 >> 0x20);
  pVar8.multiplier_ = local_3c8;
  return pVar8;
}

Assistant:

static precise_unit
    commoditizedUnit(const std::string& unit_string, std::uint64_t match_flags)
{
    auto finish = unit_string.find_last_of('}');
    if (finish == std::string::npos) {
        // there are checks before this would get called that would catch that
        // error but it is left in place just in case it gets called in an
        // isolated context

        // LCOV_EXCL_START
        return precise::invalid;
        // LCOV_EXCL_STOP
    }
    auto ccindex = static_cast<int>(finish) - 1;
    segmentcheckReverse(unit_string, '{', ccindex);

    auto cstring = unit_string.substr(
        static_cast<size_t>(ccindex) + 2, finish - ccindex - 2);

    if (ccindex < 0) {
        return {1.0, precise::one, getCommodity(cstring)};
    }

    auto bunit = unit_from_string_internal(
        unit_string.substr(0, static_cast<size_t>(ccindex) + 1),
        match_flags + no_commodities);
    if (!is_error(bunit)) {
        if (bunit.has_same_base(m)) {
            static const std::unordered_map<std::string, precise_unit>
                commUnits{
                    {"mercury", precise::pressure::bases::Hg},
                    {"mercurycolumn", precise::pressure::bases::Hg},
                    {"mercuryguage", precise::pressure::bases::Hg},
                    {"mercury_i", precise::pressure::bases::Hg},
                    {"Hg", precise::pressure::bases::Hg},
                    {"water", precise::pressure::bases::water},
                    {"watercolumn", precise::pressure::bases::water},
                    {"water_i", precise::pressure::bases::water},
                    {"waterguage", precise::pressure::bases::water},
                    {"H2O", precise::pressure::bases::water},
                    {"mercury_[00]", precise::pressure::bases::Hg_0},
                    {"water_[04]", precise::pressure::bases::water_4},
                    {"water_[39]", precise::pressure::bases::water_39},
                    {"mercury_[32]", precise::pressure::bases::Hg_32},
                    {"mercury_[60]", precise::pressure::bases::Hg_60},
                    {"water_[60]", precise::pressure::bases::water_60},
                };
            auto tunit = commUnits.find(cstring);
            if (tunit != commUnits.end()) {
                return bunit * tunit->second;
            }
        }
        return {1.0, bunit, getCommodity(cstring)};
    }
    return precise::invalid;
}